

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

format_arg * __thiscall
fmt::v8::detail::
get_arg<fmt::v8::basic_format_context<fmt::v8::appender,char>,fmt::v8::basic_string_view<char>>
          (format_arg *__return_storage_ptr__,detail *this,
          basic_format_context<fmt::v8::appender,_char> *ctx,basic_string_view<char> id)

{
  basic_string_view<char> name;
  
  name.size_ = id.data_;
  name.data_ = (char *)ctx;
  basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>::get<char>
            (__return_storage_ptr__,
             (basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)
             (this + 8),name);
  if (__return_storage_ptr__->type_ != none_type) {
    return __return_storage_ptr__;
  }
  throw_format_error("argument not found");
}

Assistant:

FMT_CONSTEXPR auto get_arg(Context& ctx, ID id) ->
    typename Context::format_arg {
  auto arg = ctx.arg(id);
  if (!arg) ctx.on_error("argument not found");
  return arg;
}